

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.hpp
# Opt level: O0

VList * Kernel::freeVariables<Kernel::Term*>(Term *thing)

{
  bool bVar1;
  FormulaVarIterator *this;
  FIFO result;
  FormulaVarIterator fvi;
  uint in_stack_ffffffffffffff0c;
  FIFO *in_stack_ffffffffffffff10;
  Term *in_stack_ffffffffffffff38;
  FormulaVarIterator *in_stack_ffffffffffffff40;
  
  FormulaVarIterator::FormulaVarIterator(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Lib::List<unsigned_int>::FIFO::FIFO((FIFO *)&stack0xffffffffffffff10);
  while( true ) {
    bVar1 = FormulaVarIterator::hasNext((FormulaVarIterator *)fvi._instructions._stack);
    if (!bVar1) break;
    FormulaVarIterator::next((FormulaVarIterator *)&stack0xffffffffffffff20);
    Lib::List<unsigned_int>::FIFO::pushBack(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  this = (FormulaVarIterator *)Lib::List<unsigned_int>::FIFO::list((FIFO *)&stack0xffffffffffffff10)
  ;
  FormulaVarIterator::~FormulaVarIterator(this);
  return (VList *)this;
}

Assistant:

VList* freeVariables(T thing)
{
  FormulaVarIterator fvi(thing);
  VList::FIFO result;
  while (fvi.hasNext()) {
    result.pushBack(fvi.next());
  }
  return result.list();
}